

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  uint uVar1;
  U32 UVar2;
  ZSTD_matchState_t *window;
  ZSTD_CCtx *local_78;
  size_t cSize;
  U32 correction;
  U32 cycleLog;
  size_t fhSize;
  ZSTD_matchState_t *ms;
  U32 frame_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  window = &(cctx->blockState).matchState;
  _correction = (ZSTD_CCtx *)0x0;
  if (cctx->stage == ZSTDcs_created) {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffc4;
  }
  else {
    src_local = (void *)dstCapacity;
    dstCapacity_local = (size_t)dst;
    if ((frame != 0) && (cctx->stage == ZSTDcs_init)) {
      _correction = (ZSTD_CCtx *)
                    ZSTD_writeFrameHeader
                              (dst,dstCapacity,cctx->appliedParams,cctx->pledgedSrcSizePlusOne - 1,
                               cctx->dictID);
      uVar1 = ERR_isError((size_t)_correction);
      if (uVar1 != 0) {
        return (size_t)_correction;
      }
      src_local = (void *)(dstCapacity - (long)_correction);
      dstCapacity_local = (long)dst + (long)_correction;
      cctx->stage = ZSTDcs_ongoing;
    }
    if (srcSize == 0) {
      cctx_local = _correction;
    }
    else {
      UVar2 = ZSTD_window_update(&window->window,src,srcSize);
      if (UVar2 == 0) {
        (cctx->blockState).matchState.nextToUpdate = (cctx->blockState).matchState.window.dictLimit;
      }
      if ((cctx->appliedParams).ldmParams.enableLdm != 0) {
        ZSTD_window_update(&(cctx->ldmState).window,src,srcSize);
      }
      if ((frame == 0) &&
         (UVar2 = ZSTD_window_needOverflowCorrection(window->window,(void *)((long)src + srcSize)),
         UVar2 != 0)) {
        UVar2 = ZSTD_cycleLog((cctx->appliedParams).cParams.chainLog,
                              (cctx->appliedParams).cParams.strategy);
        UVar2 = ZSTD_window_correctOverflow
                          (&window->window,UVar2,
                           1 << ((byte)(cctx->appliedParams).cParams.windowLog & 0x1f),src);
        ZSTD_reduceIndex(cctx,UVar2);
        if ((cctx->blockState).matchState.nextToUpdate < UVar2) {
          (cctx->blockState).matchState.nextToUpdate = 0;
        }
        else {
          (cctx->blockState).matchState.nextToUpdate =
               (cctx->blockState).matchState.nextToUpdate - UVar2;
        }
        (cctx->blockState).matchState.loadedDictEnd = 0;
        (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
      }
      if (frame == 0) {
        local_78 = (ZSTD_CCtx *)
                   ZSTD_compressBlock_internal
                             (cctx,(void *)dstCapacity_local,(size_t)src_local,src,srcSize);
      }
      else {
        local_78 = (ZSTD_CCtx *)
                   ZSTD_compress_frameChunk
                             (cctx,(void *)dstCapacity_local,(size_t)src_local,src,srcSize,
                              lastFrameChunk);
      }
      uVar1 = ERR_isError((size_t)local_78);
      if (uVar1 == 0) {
        cctx->consumedSrcSize = srcSize + cctx->consumedSrcSize;
        cctx->producedCSize =
             (long)&_correction->stage + cctx->producedCSize + (long)&local_78->stage;
        if ((cctx->pledgedSrcSizePlusOne == 0) ||
           (cctx->consumedSrcSize + 1 <= cctx->pledgedSrcSizePlusOne)) {
          cctx_local = (ZSTD_CCtx *)((long)&_correction->stage + (long)&local_78->stage);
        }
        else {
          cctx_local = (ZSTD_CCtx *)0xffffffffffffffb8;
        }
      }
      else {
        cctx_local = local_78;
      }
    }
  }
  return (size_t)cctx_local;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    if (cctx->stage==ZSTDcs_created) return ERROR(stage_wrong);   /* missing init (ZSTD_compressBegin) */

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        if (ZSTD_isError(fhSize)) return fhSize;
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize)) {
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        if (ZSTD_window_needOverflowCorrection(ms->window, (const char*)src + srcSize)) {
            U32 const cycleLog = ZSTD_cycleLog(cctx->appliedParams.cParams.chainLog, cctx->appliedParams.cParams.strategy);
            U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, 1 << cctx->appliedParams.cParams.windowLog, src);
            ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
            ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
            ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);
            ZSTD_reduceIndex(cctx, correction);
            if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
            else ms->nextToUpdate -= correction;
            ms->loadedDictEnd = 0;
            ms->dictMatchState = NULL;
        }
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize);
        if (ZSTD_isError(cSize)) return cSize;
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            if (cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne) {
                DEBUGLOG(4, "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                    (unsigned)cctx->pledgedSrcSizePlusOne-1, (unsigned)cctx->consumedSrcSize);
                return ERROR(srcSize_wrong);
            }
        }
        return cSize + fhSize;
    }
}